

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
poly::vector_impl::
allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>_>
::allocator_base(allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>_>
                 *this,allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>_>_>_>
                       *a)

{
  size_t n;
  
  this->_storage = (void_pointer)0x0;
  this->_end_storage = (void_pointer)0x0;
  n = (long)a->_end_storage - (long)a->_storage;
  if (n != 0) {
    allocate(this,n);
  }
  return;
}

Assistant:

allocator_base(const allocator_base& a)
            : allocator_base(
                allocator_traits::select_on_container_copy_construction(a.get_allocator_ref()))
        {
            if (a.size()) {
                allocate(a.size());
            }
        }